

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5500b::tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float>::gemm4xN<3>
          (tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  float *pfVar4;
  block_q5_0 *pbVar5;
  undefined1 auVar6 [16];
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 *puVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  __m256 Cv [3] [4];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  lVar7 = (n - n0) / 3;
  lVar14 = ((m - m0) / 4) * lVar7;
  lVar8 = (lVar14 + -1 + (long)this->nth) / (long)this->nth;
  lVar12 = this->ith * lVar8;
  lVar8 = lVar8 + lVar12;
  if (lVar14 <= lVar8) {
    lVar8 = lVar14;
  }
  uVar3 = this->k;
  lVar14 = this->ldc * 4;
  pfVar4 = this->C;
  while( true ) {
    if (lVar8 <= lVar12) {
      return;
    }
    auVar17 = ZEXT1664((undefined1  [16])0x0);
    lVar9 = lVar12 / lVar7;
    local_c0 = vmovdqa64_avx512f(auVar17);
    local_100 = vmovdqa64_avx512f(auVar17);
    local_140 = vmovdqa64_avx512f(auVar17);
    local_180 = vmovdqa64_avx512f(auVar17);
    local_1c0 = vmovdqa64_avx512f(auVar17);
    local_200 = vmovdqa64_avx512f(auVar17);
    lVar11 = this->lda;
    pbVar5 = this->A;
    if ((~((long)uVar3 >> 0x3f) & uVar3) != 0) break;
    lVar9 = (long)pfVar4 + lVar9 * 0x10 + ((lVar12 % lVar7) * 3 + n0) * lVar14 + m0 * 4;
    puVar10 = local_200;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 4) {
        pfVar2 = (float *)(puVar10 + lVar13 * 8 + 0x10);
        pfVar1 = (float *)(puVar10 + lVar13 * 8);
        auVar15._0_4_ = *pfVar2 + *pfVar1;
        auVar15._4_4_ = pfVar2[1] + pfVar1[1];
        auVar15._8_4_ = pfVar2[2] + pfVar1[2];
        auVar15._12_4_ = pfVar2[3] + pfVar1[3];
        auVar6 = vshufpd_avx(auVar15,auVar15,1);
        auVar16._0_4_ = auVar15._0_4_ + auVar6._0_4_;
        auVar16._4_4_ = auVar15._4_4_ + auVar6._4_4_;
        auVar16._8_4_ = auVar15._8_4_ + auVar6._8_4_;
        auVar16._12_4_ = auVar15._12_4_ + auVar6._12_4_;
        auVar6 = vhaddps_avx(auVar16,auVar16);
        *(int *)(lVar9 + lVar13) = auVar6._0_4_;
      }
      lVar9 = lVar9 + lVar14;
      puVar10 = puVar10 + 0x80;
    }
    lVar12 = lVar12 + 1;
  }
  auVar6 = vpinsrw_avx(ZEXT216(pbVar5[(m0 + lVar9 * 4) * lVar11].d),
                       (uint)pbVar5[(m0 + 1 + lVar9 * 4) * lVar11].d,1);
  auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)
                                     &((tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *)
                                      (pbVar5 + (m0 + 2 + lVar9 * 4) * lVar11))->A,2);
  auVar6 = vpinsrw_avx(auVar6,(uint)pbVar5[(m0 + 3 + lVar9 * 4) * lVar11].d,3);
  vcvtph2ps_f16c(auVar6);
  load((__m256i *)(pbVar5 + (m0 + lVar9 * 4) * lVar11),
       (tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *)(pbVar5 + (m0 + 2 + lVar9 * 4) * lVar11),
       pbVar5 + (m0 + 3 + lVar9 * 4) * lVar11);
}

Assistant:

NOINLINE void gemm4xN(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t ytiles = (m - m0) / 4;
        int64_t xtiles = (n - n0) / RN;
        int64_t tiles = xtiles * ytiles;
        int64_t duty = (tiles + nth - 1) / nth;
        int64_t start = duty * ith;
        int64_t end = start + duty;
        if (end > tiles)
            end = tiles;
        for (int64_t job = start; job < end; ++job) {
            int64_t ii = m0 + job / xtiles * 4;
            int64_t jj = n0 + job % xtiles * RN;
            __m256 Cv[RN][4] = {};
            for (int64_t l = 0; l < k; ++l) {
                uint64_t a_delta = ((uint64_t)A[lda * (ii + 3) + l].d << 48) | ((uint64_t)A[lda * (ii + 2) + l].d << 32) | ((uint64_t)A[lda * (ii + 1) + l].d << 16) | (A[lda * (ii + 0) + l].d);
                // Convert delta values for four blocks to float values
                __m128 da = _mm_cvtph_ps(_mm_set_epi64x(0, a_delta));
                __m256i avec0 = load(A + lda * (ii + 0) + l);
                __m256i avec1 = load(A + lda * (ii + 1) + l);
                __m256i avec2 = load(A + lda * (ii + 2) + l);
                __m256i avec3 = load(A + lda * (ii + 3) + l);
                for (int64_t j = 0; j < RN; ++j) {
                        __m128 db = _mm_set1_ps(unhalf(B[ldb * (jj + j) + l].d));
                        // Computation of product of delta values for four blocks and replicate it across 256 bit lane
                        __m256 dvec =  _mm256_castps128_ps256(_mm_mul_ps(da, db));
                        dvec = _mm256_permute2f128_ps(dvec ,dvec, 0);
                        // Computation of dot product and multiplication with appropriate delta value products
                        Cv[j][0] = madd(_mm256_shuffle_ps(dvec, dvec, 0),
                                    updot(_mm256_sign_epi8(avec0, avec0),
                                          _mm256_sign_epi8(load(B + ldb * (jj + j) + l), avec0)),
                                    Cv[j][0]);
                        Cv[j][1] = madd(_mm256_shuffle_ps(dvec, dvec, 85),
                                    updot(_mm256_sign_epi8(avec1, avec1),
                                            _mm256_sign_epi8(load(B + ldb * (jj + j) + l), avec1)),
                                    Cv[j][1]);
                        Cv[j][2] = madd(_mm256_shuffle_ps(dvec, dvec, 170),
                                    updot(_mm256_sign_epi8(avec2, avec2),
                                            _mm256_sign_epi8(load(B + ldb * (jj + j) + l), avec2)),
                                    Cv[j][2]);
                        Cv[j][3] = madd(_mm256_shuffle_ps(dvec, dvec, 255),
                                    updot(_mm256_sign_epi8(avec3, avec3),
                                            _mm256_sign_epi8(load(B + ldb * (jj + j) + l), avec3)),
                                    Cv[j][3]);
                }
            }

            for (int64_t j = 0; j < RN; ++j)
                for (int64_t i = 0; i < 4; ++i)
                    C[ldc * (jj + j) + (ii + i)] = hsum(Cv[j][i]);
        }
    }